

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

void lj_ctype_addname(CTState *cts,CType *ct,CTypeID id)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(ct->name).gcptr64;
  uVar2 = uVar1 + 0xfb3ee249;
  uVar1 = (uVar1 ^ uVar2) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar2 = (uVar2 >> 0xd ^ uVar1) - (uVar1 >> 0x13) & 0x7f;
  ct->next = cts->hash[uVar2];
  cts->hash[uVar2] = (CTypeID1)id;
  return;
}

Assistant:

void lj_ctype_addname(CTState *cts, CType *ct, CTypeID id)
{
  uint32_t h = ct_hashname(gcref(ct->name));
  ct->next = cts->hash[h];
  cts->hash[h] = (CTypeID1)id;
}